

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

float StrToF16(uc16 *str16,int length,int flags,double empty_string_value,
              int *processed_characters_count,bool *processed_all)

{
  float fVar1;
  StringToDoubleConverter local_48;
  
  local_48.junk_string_value_ = NAN;
  local_48.infinity_symbol_ = (char *)0x0;
  local_48.nan_symbol_ = (char *)0x0;
  local_48.separator_ = 0;
  local_48.flags_ = flags;
  local_48.empty_string_value_ = empty_string_value;
  fVar1 = double_conversion::StringToDoubleConverter::StringToFloat
                    (&local_48,str16,length,processed_characters_count);
  *processed_all = *processed_characters_count == length;
  return fVar1;
}

Assistant:

static float StrToF16(const uc16* str16, int length, int flags,
                      double empty_string_value,
                      int* processed_characters_count,
                      bool* processed_all) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL);
  double result =
      converter.StringToFloat(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}